

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O3

bool __thiscall
aom::AV1RateControlRTC::GetSegmentationData
          (AV1RateControlRTC *this,AV1SegmentationData *segmentation_data)

{
  AV1_COMP *pAVar1;
  CYCLIC_REFRESH *pCVar2;
  
  pAVar1 = this->cpi_;
  if (((pAVar1->oxcf).q_cfg.aq_mode != '\0') &&
     (pCVar2 = pAVar1->cyclic_refresh, pCVar2->apply_cyclic_refresh != 0)) {
    segmentation_data->segmentation_map = (pAVar1->enc_seg).map;
    segmentation_data->segmentation_map_size =
         (long)(pAVar1->common).mi_params.mi_cols * (long)(pAVar1->common).mi_params.mi_rows;
    segmentation_data->delta_q = pCVar2->qindex_delta;
    segmentation_data->delta_q_size = 3;
    return true;
  }
  return false;
}

Assistant:

bool AV1RateControlRTC::GetSegmentationData(
    AV1SegmentationData *segmentation_data) const {
  if (cpi_->oxcf.q_cfg.aq_mode == 0) {
    return false;
  }
  // Don't update the segmentation map if cyclic refresh is not enabled.
  if (!cpi_->cyclic_refresh->apply_cyclic_refresh) {
    return false;
  }
  segmentation_data->segmentation_map = cpi_->enc_seg.map;
  segmentation_data->segmentation_map_size =
      cpi_->common.mi_params.mi_rows * cpi_->common.mi_params.mi_cols;
  segmentation_data->delta_q = cpi_->cyclic_refresh->qindex_delta;
  segmentation_data->delta_q_size = 3u;
  return true;
}